

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

ValueHolder * __thiscall
testing::internal::
ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
::DefaultValueHolderFactory::MakeNewHolder(DefaultValueHolderFactory *this)

{
  long lVar1;
  ValueHolder *this_00;
  long in_FS_OFFSET;
  DefaultValueHolderFactory *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (ValueHolder *)operator_new(0x20);
  ValueHolder::ValueHolder(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

virtual ValueHolder* MakeNewHolder() const { return new ValueHolder(); }